

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void deqp::gles3::Functional::createQuadsTex2D
               (Context *context,deUint32 name,GLenum format,GLenum dataType,int width,int height)

{
  TextureFormat texFormat;
  PixelBufferAccess local_80;
  TextureLevel level;
  
  texFormat = glu::mapGLTransferFormat(format,0x1401);
  tcu::TextureLevel::TextureLevel(&level,&texFormat,dataType,width,1);
  tcu::TextureLevel::getAccess(&local_80,&level);
  tcu::fillWithRGBAQuads(&local_80);
  (*context->_vptr_Context[6])(context,0xde1,(ulong)name);
  tcu::TextureLevel::getAccess(&local_80,&level);
  (*context->_vptr_Context[0x11])
            (context,0xde1,0,(ulong)format,(ulong)dataType,width,0,format,0x1401,
             local_80.super_ConstPixelBufferAccess.m_data);
  (*context->_vptr_Context[0x1d])(context,0xde1,0x2801,0x2601);
  tcu::TextureLevel::~TextureLevel(&level);
  return;
}

Assistant:

static void createQuadsTex2D (sglr::Context& context, deUint32 name, GLenum format, GLenum dataType, int width, int height)
{
	tcu::TextureFormat	texFormat	= glu::mapGLTransferFormat(format, dataType);
	tcu::TextureLevel	level		(texFormat, width, height);

	tcu::fillWithRGBAQuads(level.getAccess());

	context.bindTexture(GL_TEXTURE_2D, name);
	context.texImage2D(GL_TEXTURE_2D, 0, format, width, height, 0, format, dataType, level.getAccess().getDataPtr());
	context.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
}